

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

void __thiscall FIX::SessionState::SessionState(SessionState *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_MessageStore)._vptr_MessageStore = (_func_int **)&PTR__SessionState_001efd40;
  (this->super_Log)._vptr_Log = (_func_int **)&DAT_001efde0;
  this->m_enabled = true;
  this->m_receivedLogon = false;
  this->m_sentLogout = false;
  this->m_sentLogon = false;
  this->m_sentReset = false;
  this->m_receivedReset = false;
  this->m_initiate = false;
  this->m_logonTimeout = 10;
  this->m_logoutTimeout = 2;
  this->m_testRequest = 0;
  (this->m_resendRange).first = 0;
  (this->m_resendRange).second = 0;
  HeartBtInt::HeartBtInt(&this->m_heartBtInt);
  UtcTimeStamp::UtcTimeStamp(&this->m_lastSentTime);
  UtcTimeStamp::UtcTimeStamp(&this->m_lastReceivedTime);
  (this->m_logoutReason)._M_dataplus._M_p = (pointer)&(this->m_logoutReason).field_2;
  (this->m_logoutReason)._M_string_length = 0;
  (this->m_logoutReason).field_2._M_local_buf[0] = '\0';
  (this->m_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->m_queue)._M_t._M_impl.super__Rb_tree_header;
  (this->m_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_queue)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_pStore = (MessageStore *)0x0;
  this->m_pLog = (Log *)0x0;
  (this->m_nullLog).super_Log._vptr_Log = (_func_int **)&PTR__Log_001ee7b0;
  Mutex::Mutex(&this->m_mutex);
  return;
}

Assistant:

SessionState()
: m_enabled( true ), m_receivedLogon( false ),
  m_sentLogout( false ), m_sentLogon( false ),
  m_sentReset( false ), m_receivedReset( false ),
  m_initiate( false ), m_logonTimeout( 10 ), 
  m_logoutTimeout( 2 ), m_testRequest( 0 ),
  m_pStore( 0 ), m_pLog( 0 ) {}